

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O3

FIOBJ fiobj_hash_pop(FIOBJ hash,FIOBJ *key)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (((uint)hash & 7) != 4) {
    __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                  ,0xdb,"FIOBJ fiobj_hash_pop(FIOBJ, FIOBJ *)");
  }
  uVar6 = hash & 0xfffffffffffffff8;
  if (*(long *)(uVar6 + 8) == 0) {
    lVar2 = *(long *)(uVar6 + 0x20);
    if ((lVar2 == 0) || (*(long *)(uVar6 + 0x18) == 0)) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ulong *)(lVar2 + -8 + *(long *)(uVar6 + 0x18) * 0x18);
    }
    if ((((~(uint)uVar7 & 6) != 0) && (uVar7 != 0)) && ((uVar7 & 1) == 0)) {
      LOCK();
      piVar1 = (int *)((uVar7 & 0xfffffffffffffff8) + 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      lVar2 = *(long *)(uVar6 + 0x20);
    }
    if (key != (FIOBJ *)0x0) {
      if ((lVar2 == 0) || (*(long *)(uVar6 + 0x18) == 0)) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ulong *)(lVar2 + -0x10 + *(long *)(uVar6 + 0x18) * 0x18);
      }
      if ((((~(uint)uVar4 & 6) != 0) && (uVar4 != 0)) && ((uVar4 & 1) == 0)) {
        LOCK();
        piVar1 = (int *)((uVar4 & 0xfffffffffffffff8) + 4);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
        lVar2 = *(long *)(uVar6 + 0x20);
      }
      *key = uVar4;
    }
    if ((lVar2 != 0) && (*(long *)(uVar6 + 0x18) != 0)) {
      fiobj_free(*(FIOBJ *)(lVar2 + -0x10 + *(long *)(uVar6 + 0x18) * 0x18));
      lVar2 = *(long *)(uVar6 + 0x18);
      lVar3 = *(long *)(uVar6 + 0x20);
      *(undefined8 *)(lVar3 + -0x10 + lVar2 * 0x18) = 0;
      fiobj_free(*(FIOBJ *)(lVar3 + -8 + lVar2 * 0x18));
      lVar3 = *(long *)(uVar6 + 0x18);
      lVar2 = *(long *)(uVar6 + 0x20) + lVar3 * 0x18;
      plVar5 = (long *)(lVar2 + -0x30);
      *(undefined8 *)(lVar2 + -8) = 0;
      *(undefined8 *)(lVar2 + -0x18) = 0;
      *(long *)(uVar6 + 8) = *(long *)(uVar6 + 8) + -1;
      do {
        lVar3 = lVar3 + -1;
        if (lVar3 == 0) break;
        lVar2 = *plVar5;
        plVar5 = plVar5 + -3;
      } while (lVar2 == 0);
      *(long *)(uVar6 + 0x18) = lVar3;
    }
  }
  else {
    uVar7 = 0;
  }
  return uVar7;
}

Assistant:

FIOBJ fiobj_hash_pop(FIOBJ hash, FIOBJ *key) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  FIOBJ old;
  if (fio_hash___count(&obj2hash(hash)->hash))
    return FIOBJ_INVALID;
  old = fiobj_dup(fio_hash___last(&obj2hash(hash)->hash).obj);
  if (key)
    *key = fiobj_dup(fio_hash___last(&obj2hash(hash)->hash).key);
  fio_hash___pop(&obj2hash(hash)->hash);
  return old;
}